

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGame.cpp
# Opt level: O0

void __thiscall
BayesianGame::BayesianGame
          (BayesianGame *this,size_t nrAgents,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrActions,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrTypes)

{
  vector<RewardModelMapping,_std::allocator<RewardModelMapping>_> *in_RDI;
  Index i;
  RewardModelMapping r;
  RewardModelMapping *this_00;
  value_type *__x;
  undefined4 in_stack_ffffffffffffff00;
  uint uVar1;
  int in_stack_ffffffffffffff04;
  string *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff18;
  BayesianGameBase *in_stack_ffffffffffffff20;
  allocator<char> local_c1;
  string local_c0 [192];
  
  BayesianGameBase::BayesianGameBase
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff10,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff08,
             in_stack_ffffffffffffff04);
  (in_RDI->super__Vector_base<RewardModelMapping,_std::allocator<RewardModelMapping>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__BayesianGame_00d064f8;
  __x = (value_type *)
        &in_RDI[9].super__Vector_base<RewardModelMapping,_std::allocator<RewardModelMapping>_>.
         _M_impl.super__Vector_impl_data._M_finish;
  std::vector<RewardModelMapping,_std::allocator<RewardModelMapping>_>::vector
            ((vector<RewardModelMapping,_std::allocator<RewardModelMapping>_> *)0x8acb78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  this_00 = (RewardModelMapping *)&stack0xffffffffffffff07;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  RewardModelMapping::RewardModelMapping
            ((RewardModelMapping *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             (size_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (string *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff07);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  for (uVar1 = 0;
      (pointer)(ulong)uVar1 <
      in_RDI[5].super__Vector_base<RewardModelMapping,_std::allocator<RewardModelMapping>_>._M_impl.
      super__Vector_impl_data._M_start; uVar1 = uVar1 + 1) {
    std::vector<RewardModelMapping,_std::allocator<RewardModelMapping>_>::push_back(in_RDI,__x);
  }
  RewardModelMapping::~RewardModelMapping(this_00);
  return;
}

Assistant:

BayesianGame::BayesianGame(size_t nrAgents, const vector<size_t> &nrActions,  
                           const vector<size_t> &nrTypes) :
    BayesianGameBase(nrAgents, nrActions, nrTypes)
{
    //initialize the utility functions
    RewardModelMapping r(_m_nrJTypes, _m_nrJA, "type", "ja");
    for(Index i = 0; i < _m_nrAgents; i++)
        _m_utilFuncs.push_back(r); //r is copied by value so we get independent
        //copies in _m_utilFuncs.

}